

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O3

void __thiscall
vkt::texture::util::TextureRenderer::add2DTexture(TextureRenderer *this,TestTexture2DSp *texture)

{
  deInt32 *pdVar1;
  Context *context;
  TextureBinding *this_00;
  TestTextureSp local_38;
  SharedPtr<vkt::texture::util::TextureBinding> local_28;
  
  this_00 = (TextureBinding *)operator_new(0x70);
  context = this->m_context;
  local_38.m_ptr = &texture->m_ptr->super_TestTexture;
  local_38.m_state = texture->m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  TextureBinding::TextureBinding(this_00,context,&local_38,TYPE_2D);
  local_28.m_state = (SharedPtrStateBase *)0x0;
  local_28.m_ptr = this_00;
  local_28.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_28.m_state)->strongRefCount = 0;
  (local_28.m_state)->weakRefCount = 0;
  (local_28.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d39830;
  local_28.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  (local_28.m_state)->strongRefCount = 1;
  (local_28.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<vkt::texture::util::TextureBinding>,std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>>>
  ::emplace_back<de::SharedPtr<vkt::texture::util::TextureBinding>>
            ((vector<de::SharedPtr<vkt::texture::util::TextureBinding>,std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>>>
              *)&this->m_textureBindings,&local_28);
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.m_ptr = (TextureBinding *)0x0;
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_28.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_28.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_28.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_28.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.m_ptr = (TestTexture *)0x0;
      (*(local_38.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_38.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_38.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_38.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void TextureRenderer::add2DTexture (const TestTexture2DSp& texture)
{
	m_textureBindings.push_back(TextureBindingSp(new TextureBinding(m_context, texture, TextureBinding::TYPE_2D)));
}